

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

bool __thiscall
Ptex::v2_2::PtexReaderCache::findFile
          (PtexReaderCache *this,char **filename,string *buffer,String *error)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  reference pvVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *in_RCX;
  string *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  string errstr;
  size_t size;
  size_t i;
  stat statbuf;
  bool isAbsolute;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  allocator<char> local_f1;
  string local_f0 [16];
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  stat local_c0;
  undefined1 local_29;
  string *local_28;
  string *local_20;
  undefined8 *local_18;
  byte local_1;
  
  local_29 = *(char *)*in_RSI == '/';
  if (!(bool)local_29) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_ffffffffffffff00);
    if (!bVar1) {
      std::__cxx11::string::reserve((ulong)local_20);
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x48));
      for (; local_c8 < this_00;
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_c8->field_0x1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x48),(size_type)local_c8);
        std::__cxx11::string::operator=(local_20,(string *)pvVar3);
        std::__cxx11::string::operator+=(local_20,"/");
        std::__cxx11::string::operator+=(local_20,(char *)*local_18);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar2 = stat(pcVar4,&local_c0);
        if (iVar2 == 0) {
          uVar5 = std::__cxx11::string::c_str();
          *local_18 = uVar5;
          local_1 = 1;
          goto LAB_0090961f;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::operator+=(local_f0,(char *)*local_18);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::operator=(local_28,pcVar4);
      local_1 = 0;
      std::__cxx11::string::~string(local_f0);
      goto LAB_0090961f;
    }
  }
  local_1 = 1;
LAB_0090961f:
  return (bool)(local_1 & 1);
}

Assistant:

bool PtexReaderCache::findFile(const char*& filename, std::string& buffer, Ptex::String& error)
{
    bool isAbsolute = (filename[0] == '/'
#ifdef WINDOWS
                       || filename[0] == '\\'
                       || (isalpha(filename[0]) && filename[1] == ':')
#endif
    );
    if (isAbsolute || _searchdirs.empty()) return true; // no need to search

    // file is relative, search in searchpath
    buffer.reserve(256); // minimize reallocs (will grow automatically)
    struct stat statbuf;
    for (size_t i = 0, size = _searchdirs.size(); i < size; i++) {
        buffer = _searchdirs[i];
        buffer += "/";
        buffer += filename;
        if (stat(buffer.c_str(), &statbuf) == 0) {
            filename = buffer.c_str();
            return true;
        }
    }
    // not found
    std::string errstr = "Can't find ptex file: ";
    errstr += filename;
    error = errstr.c_str();
    return false;
}